

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arg.h
# Opt level: O1

void TCLAP::ExtractValue<unsigned_long>(unsigned_long *destVal,string *strVal,ValueLike *vl)

{
  int iVar1;
  ArgParseException *pAVar2;
  long *plVar3;
  size_type *psVar4;
  uint uVar5;
  bool bVar6;
  istringstream is;
  string local_208;
  string local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  ulong local_1a8 [4];
  byte abStack_188 [88];
  ios_base local_130 [264];
  
  std::__cxx11::istringstream::istringstream((istringstream *)local_1a8,(string *)strVal,_S_in);
  uVar5 = 0;
  bVar6 = false;
  if (*(int *)(abStack_188 + *(long *)(local_1a8[0] - 0x18)) == 0) {
    do {
      iVar1 = std::istream::peek();
      if (iVar1 == -1) break;
      std::istream::_M_extract<unsigned_long>(local_1a8);
      uVar5 = uVar5 + 1;
    } while (*(int *)(abStack_188 + *(long *)(local_1a8[0] - 0x18)) == 0);
    bVar6 = 1 < uVar5;
  }
  if ((abStack_188[*(long *)(local_1a8[0] - 0x18)] & 5) != 0) {
    pAVar2 = (ArgParseException *)__cxa_allocate_exception(0x68);
    std::operator+(&local_1c8,"Couldn\'t read argument value from string \'",strVal);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_1c8);
    local_208._M_dataplus._M_p = (pointer)*plVar3;
    psVar4 = (size_type *)(plVar3 + 2);
    if ((size_type *)local_208._M_dataplus._M_p == psVar4) {
      local_208.field_2._M_allocated_capacity = *psVar4;
      local_208.field_2._8_4_ = (undefined4)plVar3[3];
      local_208.field_2._12_4_ = *(undefined4 *)((long)plVar3 + 0x1c);
      local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    }
    else {
      local_208.field_2._M_allocated_capacity = *psVar4;
    }
    local_208._M_string_length = plVar3[1];
    *plVar3 = (long)psVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"undefined","");
    ArgParseException::ArgParseException(pAVar2,&local_208,&local_1e8);
    __cxa_throw(pAVar2,&ArgParseException::typeinfo,ArgException::~ArgException);
  }
  if (!bVar6) {
    std::__cxx11::istringstream::~istringstream((istringstream *)local_1a8);
    std::ios_base::~ios_base(local_130);
    return;
  }
  pAVar2 = (ArgParseException *)__cxa_allocate_exception(0x68);
  std::operator+(&local_1c8,"More than one valid value parsed from string \'",strVal);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_1c8);
  local_208._M_dataplus._M_p = (pointer)*plVar3;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((size_type *)local_208._M_dataplus._M_p == psVar4) {
    local_208.field_2._M_allocated_capacity = *psVar4;
    local_208.field_2._8_4_ = (undefined4)plVar3[3];
    local_208.field_2._12_4_ = *(undefined4 *)((long)plVar3 + 0x1c);
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  }
  else {
    local_208.field_2._M_allocated_capacity = *psVar4;
  }
  local_208._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"undefined","");
  ArgParseException::ArgParseException(pAVar2,&local_208,&local_1e8);
  __cxa_throw(pAVar2,&ArgParseException::typeinfo,ArgException::~ArgException);
}

Assistant:

void
ExtractValue(T &destVal, const std::string& strVal, ValueLike vl)
{
    static_cast<void>(vl); // Avoid warning about unused vl
    std::istringstream is(strVal);

    int valuesRead = 0;
    while ( is.good() ) {
	if ( is.peek() != EOF )
#ifdef TCLAP_SETBASE_ZERO
	    is >> std::setbase(0) >> destVal;
#else
	    is >> destVal;
#endif
	else
	    break;

	valuesRead++;
    }

    if ( is.fail() )
	throw( ArgParseException("Couldn't read argument value "
				 "from string '" + strVal + "'"));


    if ( valuesRead > 1 )
	throw( ArgParseException("More than one valid value parsed from "
				 "string '" + strVal + "'"));

}